

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFile.h
# Opt level: O1

Object * Assimp::STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcFeatureElement,_0UL>::Construct
                   (DB *db,LIST *params)

{
  IfcFeatureElement *in;
  
  in = (IfcFeatureElement *)operator_new(0x160);
  *(undefined ***)&(in->super_IfcElement).field_0x148 = &PTR__Object_00836880;
  *(undefined8 *)&in->field_0x150 = 0;
  *(char **)&in->field_0x158 = "IfcFeatureElement";
  Assimp::IFC::Schema_2x3::IfcElement::IfcElement
            ((IfcElement *)in,&PTR_construction_vtable_24__00851c50);
  *(undefined ***)&(in->super_IfcElement).super_IfcProduct.super_IfcObject =
       &PTR__IfcFeatureElement_00851b48;
  *(undefined ***)&(in->super_IfcElement).field_0x148 = &PTR__IfcFeatureElement_00851c38;
  *(undefined ***)&(in->super_IfcElement).super_IfcProduct.super_IfcObject.field_0x88 =
       &PTR__IfcFeatureElement_00851b70;
  (in->super_IfcElement).super_IfcProduct.super_IfcObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>._vptr_ObjectHelper =
       (_func_int **)&PTR__IfcFeatureElement_00851b98;
  *(undefined ***)&(in->super_IfcElement).super_IfcProduct.super_IfcObject.field_0xd0 =
       &PTR__IfcFeatureElement_00851bc0;
  *(undefined ***)&(in->super_IfcElement).super_IfcProduct.field_0x100 =
       &PTR__IfcFeatureElement_00851be8;
  *(undefined ***)&(in->super_IfcElement).field_0x138 = &PTR__IfcFeatureElement_00851c10;
  GenericFill<Assimp::IFC::Schema_2x3::IfcFeatureElement>(db,params,in);
  return (Object *)
         (&(in->super_IfcElement).super_IfcProduct.super_IfcObject.field_0x0 +
         *(long *)(*(long *)&(in->super_IfcElement).super_IfcProduct.super_IfcObject + -0x18));
}

Assistant:

static Object* Construct(const STEP::DB& db, const EXPRESS::LIST& params) {
            // make sure we don't leak if Fill() throws an exception
            std::unique_ptr<TDerived> impl(new TDerived());

            // GenericFill<T> is undefined so we need to have a specialization
            const size_t num_args = GenericFill<TDerived>(db,params,&*impl);
            (void)num_args;

            // the following check is commented because it will always trigger if
            // parts of the entities are generated with dummy wrapper code.
            // This is currently done to reduce the size of the loader
            // code.
            //if (num_args != params.GetSize() && impl->GetClassName() != "NotImplemented") {
            //  DefaultLogger::get()->debug("STEP: not all parameters consumed");
            //}
            return impl.release();
        }